

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O3

void testutil_random_scalar_order(secp256k1_scalar *num)

{
  undefined4 extraout_EAX;
  int iVar1;
  undefined1 auVar2 [16];
  int overflow;
  uchar b32 [32];
  int local_3c;
  uchar local_38 [32];
  
  do {
    do {
      local_3c = 0;
      testrand256(local_38);
      secp256k1_scalar_set_b32(num,local_38,&local_3c);
    } while (local_3c != 0);
    auVar2._0_4_ = -(uint)((int)num->d[2] == 0 && (int)num->d[0] == 0);
    auVar2._4_4_ = -(uint)(*(int *)((long)num->d + 0x14) == 0 && *(int *)((long)num->d + 4) == 0);
    auVar2._8_4_ = -(uint)((int)num->d[3] == 0 && (int)num->d[1] == 0);
    auVar2._12_4_ = -(uint)(*(int *)((long)num->d + 0x1c) == 0 && *(int *)((long)num->d + 0xc) == 0)
    ;
    iVar1 = movmskps(extraout_EAX,auVar2);
  } while (iVar1 == 0xf);
  return;
}

Assistant:

static void testutil_random_scalar_order(secp256k1_scalar *num) {
    do {
        unsigned char b32[32];
        int overflow = 0;
        testrand256(b32);
        secp256k1_scalar_set_b32(num, b32, &overflow);
        if (overflow || secp256k1_scalar_is_zero(num)) {
            continue;
        }
        break;
    } while(1);
}